

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces_tests.cpp
# Opt level: O0

void __thiscall interfaces_tests::findCommonAncestor::test_method(findCommonAncestor *this)

{
  bool bVar1;
  CBlockIndex *pCVar2;
  pointer pCVar3;
  FoundBlock *pFVar4;
  FoundBlock *pFVar5;
  long in_FS_OFFSET;
  int i_1;
  int i;
  CBlockIndex *orig_tip;
  CChain *active;
  unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *chain;
  int orig_height;
  int fork_height;
  uint256 orig_hash;
  uint256 active_hash;
  uint256 fork_hash;
  BlockValidationState state;
  char *in_stack_fffffffffffff3e8;
  lazy_ostream *in_stack_fffffffffffff3f0;
  char *in_stack_fffffffffffff3f8;
  CChain *in_stack_fffffffffffff400;
  char *in_stack_fffffffffffff408;
  CKey *in_stack_fffffffffffff410;
  const_string *msg;
  size_t in_stack_fffffffffffff418;
  undefined1 *puVar6;
  const_string *in_stack_fffffffffffff420;
  char *file;
  Chainstate *in_stack_fffffffffffff428;
  unit_test_log_t *this_00;
  CPubKey *in_stack_fffffffffffff430;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *in_stack_fffffffffffff438;
  TestChain100Setup *in_stack_fffffffffffff440;
  undefined8 *puVar7;
  CBlockIndex *in_stack_fffffffffffff5b8;
  BlockValidationState *in_stack_fffffffffffff5c0;
  Chainstate *in_stack_fffffffffffff5c8;
  int local_994;
  int local_97c;
  undefined1 local_958 [16];
  undefined1 local_948 [32];
  undefined1 local_928 [16];
  const_string local_918;
  undefined1 local_908 [16];
  undefined1 local_8f8 [64];
  const_string local_8b8 [2];
  lazy_ostream local_898 [2];
  assertion_result local_878 [2];
  const_string local_840 [2];
  lazy_ostream local_820 [2];
  assertion_result local_800 [2];
  undefined1 local_7c8 [16];
  undefined1 local_7b8 [68];
  lazy_ostream local_774;
  undefined1 local_760 [64];
  undefined1 local_720 [16];
  undefined1 local_710 [64];
  const_string local_6d0 [2];
  lazy_ostream local_6b0 [2];
  assertion_result local_690 [2];
  undefined1 local_658 [4];
  undefined1 local_654 [4];
  lazy_ostream local_650;
  undefined1 local_638 [64];
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  lazy_ostream local_5d8;
  undefined1 local_5c0 [72];
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined8 local_508;
  undefined8 local_500;
  undefined8 local_4f8;
  undefined8 local_4f0;
  undefined8 local_4e8;
  undefined1 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined1 local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined8 local_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined1 local_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 local_3e0;
  undefined8 local_3d8;
  undefined8 local_3d0;
  undefined8 local_3c8;
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined1 local_3a0;
  undefined8 local_398;
  undefined8 local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined1 local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  lazy_ostream local_2a8 [2];
  lazy_ostream local_288 [2];
  undefined1 local_268 [32];
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_201 [32];
  undefined1 local_1e1 [32];
  undefined1 local_1c1 [32];
  lazy_ostream local_1a1 [2];
  undefined1 local_181 [32];
  undefined1 local_161 [32];
  undefined1 local_141 [313];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff428,(char *)in_stack_fffffffffffff420,
             (int)(in_stack_fffffffffffff418 >> 0x20),&in_stack_fffffffffffff410->fCompressed,
             in_stack_fffffffffffff408);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_fffffffffffff3e8);
  ChainstateManager::GetMutex((ChainstateManager *)in_stack_fffffffffffff3e8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff3e8);
  test_method::anon_class_8_1_8991fb9c::operator()
            ((anon_class_8_1_8991fb9c *)in_stack_fffffffffffff438);
  pCVar2 = CChain::Tip((CChain *)in_stack_fffffffffffff3f8);
  for (local_97c = 0; local_97c < 10; local_97c = local_97c + 1) {
    BlockValidationState::BlockValidationState((BlockValidationState *)in_stack_fffffffffffff3e8);
    std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator->
              ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
               in_stack_fffffffffffff3e8);
    ChainstateManager::ActiveChainstate((ChainstateManager *)in_stack_fffffffffffff3f8);
    CChain::Tip((CChain *)in_stack_fffffffffffff3f8);
    Chainstate::InvalidateBlock
              (in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8);
    BlockValidationState::~BlockValidationState((BlockValidationState *)in_stack_fffffffffffff3e8);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff428,in_stack_fffffffffffff420,
               in_stack_fffffffffffff418,(const_string *)in_stack_fffffffffffff410);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff3f0,(char (*) [1])in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    local_5d8._vptr_lazy_ostream._4_4_ = CChain::Height((CChain *)in_stack_fffffffffffff3e8);
    local_5d8._vptr_lazy_ostream._0_4_ = pCVar2->nHeight + -10;
    in_stack_fffffffffffff3f8 = "orig_tip->nHeight - 10";
    in_stack_fffffffffffff3f0 = &local_5d8;
    in_stack_fffffffffffff3e8 = "active.Height()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_5c0,&local_5d8.m_empty,0x6b,1,2,
               (undefined1 *)((long)&local_5d8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CKey::MakeNewKey((CKey *)in_stack_fffffffffffff3f8,
                   SUB81((ulong)in_stack_fffffffffffff3f0 >> 0x38,0));
  for (local_994 = 0; local_994 < 0x14; local_994 = local_994 + 1) {
    local_5f8 = 0;
    uStack_5f0 = 0;
    local_5e8 = 0;
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
               in_stack_fffffffffffff3e8);
    CKey::GetPubKey(in_stack_fffffffffffff410);
    GetScriptForRawPubKey(in_stack_fffffffffffff430);
    TestChain100Setup::CreateAndProcessBlock
              (in_stack_fffffffffffff440,in_stack_fffffffffffff438,
               (CScript *)in_stack_fffffffffffff430,in_stack_fffffffffffff428);
    CBlock::~CBlock((CBlock *)in_stack_fffffffffffff3e8);
    CScript::~CScript((CScript *)in_stack_fffffffffffff3e8);
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
               in_stack_fffffffffffff3f8);
  }
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff428,in_stack_fffffffffffff420,
               in_stack_fffffffffffff418,(const_string *)in_stack_fffffffffffff410);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff3f0,(char (*) [1])in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    local_650._vptr_lazy_ostream._4_4_ = CChain::Height((CChain *)in_stack_fffffffffffff3e8);
    local_650._vptr_lazy_ostream._0_4_ = pCVar2->nHeight + 10;
    in_stack_fffffffffffff3f8 = "orig_tip->nHeight + 10";
    in_stack_fffffffffffff3f0 = &local_650;
    in_stack_fffffffffffff3e8 = "active.Height()";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_638,&local_650.m_empty,0x70,1,2,
               (undefined1 *)((long)&local_650._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  uint256::uint256((uint256 *)in_stack_fffffffffffff3e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff428,in_stack_fffffffffffff420,
               in_stack_fffffffffffff418,(const_string *)in_stack_fffffffffffff410);
    pCVar3 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_fffffffffffff3e8);
    puVar6 = local_161;
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff3f8);
    CChain::Tip((CChain *)in_stack_fffffffffffff3f8);
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff3f8);
    local_2b8 = 0;
    uStack_2b0 = 0;
    local_2c8 = 0;
    uStack_2c0 = 0;
    local_2d8 = 0;
    uStack_2d0 = 0;
    local_2e8 = 0;
    uStack_2e0 = 0;
    local_2f8 = 0;
    uStack_2f0 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_fffffffffffff3e8);
    interfaces::FoundBlock::height
              ((FoundBlock *)in_stack_fffffffffffff3f8,(int *)in_stack_fffffffffffff3f0);
    pFVar4 = interfaces::FoundBlock::hash
                       ((FoundBlock *)in_stack_fffffffffffff3f8,(uint256 *)in_stack_fffffffffffff3f0
                       );
    local_308 = 0;
    uStack_300 = 0;
    local_318 = 0;
    uStack_310 = 0;
    local_328 = 0;
    uStack_320 = 0;
    local_338 = 0;
    uStack_330 = 0;
    local_348 = 0;
    uStack_340 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_fffffffffffff3e8);
    pFVar5 = interfaces::FoundBlock::height
                       ((FoundBlock *)in_stack_fffffffffffff3f8,(int *)in_stack_fffffffffffff3f0);
    local_398 = 0;
    local_390 = 0;
    local_388 = 0;
    local_380 = 0;
    local_378 = 0;
    local_370 = 0;
    local_368 = 0;
    local_360 = 0;
    local_358 = 0;
    local_350 = 0;
    (*pCVar3->_vptr_Chain[0xe])(pCVar3,puVar6,local_181,pFVar4,pFVar5,&local_398);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff3f8,
               SUB81((ulong)in_stack_fffffffffffff3f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff3f0,(basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    in_stack_fffffffffffff3e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_690,local_6b0,local_6d0,0x74,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff428,in_stack_fffffffffffff420,
               in_stack_fffffffffffff418,(const_string *)in_stack_fffffffffffff410);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff3f0,(char (*) [1])in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    in_stack_fffffffffffff3f0 = (lazy_ostream *)&pCVar2->nHeight;
    in_stack_fffffffffffff3f8 = "orig_tip->nHeight";
    in_stack_fffffffffffff3e8 = "orig_height";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_710,local_720,0x75,1,2,local_658);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff428,in_stack_fffffffffffff420,
               in_stack_fffffffffffff418,(const_string *)in_stack_fffffffffffff410);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff3f0,(char (*) [1])in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    local_774._vptr_lazy_ostream._0_4_ = pCVar2->nHeight + -10;
    in_stack_fffffffffffff3f8 = "orig_tip->nHeight - 10";
    in_stack_fffffffffffff3f0 = &local_774;
    in_stack_fffffffffffff3e8 = "fork_height";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_760,(undefined1 *)((long)&local_774._vptr_lazy_ostream + 4),0x76,1,2,local_654)
    ;
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff428,in_stack_fffffffffffff420,
               in_stack_fffffffffffff418,(const_string *)in_stack_fffffffffffff410);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff3f0,(char (*) [1])in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    CChain::operator[](in_stack_fffffffffffff400,(int)((ulong)in_stack_fffffffffffff3f8 >> 0x20));
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff3f8);
    in_stack_fffffffffffff3f8 = "active[fork_height]->GetBlockHash()";
    in_stack_fffffffffffff3f0 = local_1a1;
    in_stack_fffffffffffff3e8 = "fork_hash";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_7b8,local_7c8,0x77,1,2,local_141);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  uint256::uint256((uint256 *)in_stack_fffffffffffff3e8);
  uint256::uint256((uint256 *)in_stack_fffffffffffff3e8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff428,in_stack_fffffffffffff420,
               in_stack_fffffffffffff418,(const_string *)in_stack_fffffffffffff410);
    pCVar3 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_fffffffffffff3e8);
    CChain::Tip((CChain *)in_stack_fffffffffffff3f8);
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff3f8);
    local_218 = 0;
    uStack_210 = 0;
    local_228 = 0;
    uStack_220 = 0;
    puVar7 = &local_228;
    uint256::uint256((uint256 *)in_stack_fffffffffffff3e8);
    local_3e8 = 0;
    local_3e0 = 0;
    local_3d8 = 0;
    local_3d0 = 0;
    local_3c8 = 0;
    local_3c0 = 0;
    local_3b8 = 0;
    local_3b0 = 0;
    local_3a8 = 0;
    local_3a0 = 0;
    local_3f8 = 0;
    uStack_3f0 = 0;
    local_408 = 0;
    uStack_400 = 0;
    local_418 = 0;
    uStack_410 = 0;
    local_428 = 0;
    uStack_420 = 0;
    local_438 = 0;
    uStack_430 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_fffffffffffff3e8);
    pFVar4 = interfaces::FoundBlock::hash
                       ((FoundBlock *)in_stack_fffffffffffff3f8,(uint256 *)in_stack_fffffffffffff3f0
                       );
    local_488 = 0;
    local_480 = 0;
    local_478 = 0;
    local_470 = 0;
    local_468 = 0;
    local_460 = 0;
    local_458 = 0;
    local_450 = 0;
    local_448 = 0;
    local_440 = 0;
    (*pCVar3->_vptr_Chain[0xe])(pCVar3,local_201,puVar7,&local_3e8,pFVar4,&local_488);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff3f8,
               SUB81((ulong)in_stack_fffffffffffff3f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff3f0,(basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    in_stack_fffffffffffff3e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_800,local_820,local_840,0x7a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff428,in_stack_fffffffffffff420,
               in_stack_fffffffffffff418,(const_string *)in_stack_fffffffffffff410);
    pCVar3 = std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::operator->
                       ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
                        in_stack_fffffffffffff3e8);
    local_238 = 0;
    uStack_230 = 0;
    local_248 = 0;
    uStack_240 = 0;
    uint256::uint256((uint256 *)in_stack_fffffffffffff3e8);
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff3f8);
    local_4d8 = 0;
    local_4d0 = 0;
    local_4c8 = 0;
    local_4c0 = 0;
    local_4b8 = 0;
    local_4b0 = 0;
    local_4a8 = 0;
    local_4a0 = 0;
    local_498 = 0;
    local_490 = 0;
    local_528 = 0;
    local_520 = 0;
    local_518 = 0;
    local_510 = 0;
    local_508 = 0;
    local_500 = 0;
    local_4f8 = 0;
    local_4f0 = 0;
    local_4e8 = 0;
    local_4e0 = 0;
    local_538 = 0;
    uStack_530 = 0;
    local_548 = 0;
    uStack_540 = 0;
    local_558 = 0;
    uStack_550 = 0;
    local_568 = 0;
    uStack_560 = 0;
    local_578 = 0;
    uStack_570 = 0;
    interfaces::FoundBlock::FoundBlock((FoundBlock *)in_stack_fffffffffffff3e8);
    pFVar4 = interfaces::FoundBlock::hash
                       ((FoundBlock *)in_stack_fffffffffffff3f8,(uint256 *)in_stack_fffffffffffff3f0
                       );
    (*pCVar3->_vptr_Chain[0xe])(pCVar3,&local_248,local_268,&local_4d8,&local_528,pFVar4);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff3f8,
               SUB81((ulong)in_stack_fffffffffffff3f0 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff3f0,(basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    in_stack_fffffffffffff3e8 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_878,local_898,local_8b8,0x7b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff3e8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff3e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff428,in_stack_fffffffffffff420,
               in_stack_fffffffffffff418,(const_string *)in_stack_fffffffffffff410);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff3f0,(char (*) [1])in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    CChain::Tip((CChain *)in_stack_fffffffffffff3f8);
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff3f8);
    in_stack_fffffffffffff3f8 = "active.Tip()->GetBlockHash()";
    in_stack_fffffffffffff3f0 = local_288;
    in_stack_fffffffffffff3e8 = "active_hash";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_8f8,local_908,0x7c,1,2,local_1c1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/interfaces_tests.cpp"
    ;
    msg = &local_918;
    this_00 = (unit_test_log_t *)0x69;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    puVar6 = local_928;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3e8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,(const_string *)file,(size_t)puVar6,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff3f0,(char (*) [1])in_stack_fffffffffffff3e8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff3f8,
               (pointer)in_stack_fffffffffffff3f0,(unsigned_long)in_stack_fffffffffffff3e8);
    CBlockIndex::GetBlockHash((CBlockIndex *)in_stack_fffffffffffff3f8);
    in_stack_fffffffffffff3f8 = "orig_tip->GetBlockHash()";
    in_stack_fffffffffffff3f0 = local_2a8;
    in_stack_fffffffffffff3e8 = "orig_hash";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (local_948,local_958,0x7d,1,2,local_1e1);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff3e8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(findCommonAncestor)
{
    auto& chain = m_node.chain;
    const CChain& active{*WITH_LOCK(Assert(m_node.chainman)->GetMutex(), return &Assert(m_node.chainman)->ActiveChain())};
    auto* orig_tip = active.Tip();
    for (int i = 0; i < 10; ++i) {
        BlockValidationState state;
        m_node.chainman->ActiveChainstate().InvalidateBlock(state, active.Tip());
    }
    BOOST_CHECK_EQUAL(active.Height(), orig_tip->nHeight - 10);
    coinbaseKey.MakeNewKey(true);
    for (int i = 0; i < 20; ++i) {
        CreateAndProcessBlock({}, GetScriptForRawPubKey(coinbaseKey.GetPubKey()));
    }
    BOOST_CHECK_EQUAL(active.Height(), orig_tip->nHeight + 10);
    uint256 fork_hash;
    int fork_height;
    int orig_height;
    BOOST_CHECK(chain->findCommonAncestor(orig_tip->GetBlockHash(), active.Tip()->GetBlockHash(), FoundBlock().height(fork_height).hash(fork_hash), FoundBlock().height(orig_height)));
    BOOST_CHECK_EQUAL(orig_height, orig_tip->nHeight);
    BOOST_CHECK_EQUAL(fork_height, orig_tip->nHeight - 10);
    BOOST_CHECK_EQUAL(fork_hash, active[fork_height]->GetBlockHash());

    uint256 active_hash, orig_hash;
    BOOST_CHECK(!chain->findCommonAncestor(active.Tip()->GetBlockHash(), {}, {}, FoundBlock().hash(active_hash), {}));
    BOOST_CHECK(!chain->findCommonAncestor({}, orig_tip->GetBlockHash(), {}, {}, FoundBlock().hash(orig_hash)));
    BOOST_CHECK_EQUAL(active_hash, active.Tip()->GetBlockHash());
    BOOST_CHECK_EQUAL(orig_hash, orig_tip->GetBlockHash());
}